

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# densehashtable.h
# Opt level: O0

void __thiscall
google::
dense_hashtable<std::pair<const_int,_int>,_int,_Hasher,_google::dense_hash_map<int,_int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::SelectKey,_google::dense_hash_map<int,_int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::SetKey,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
::dense_hashtable(dense_hashtable<std::pair<const_int,_int>,_int,_Hasher,_google::dense_hash_map<int,_int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::SelectKey,_google::dense_hash_map<int,_int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::SetKey,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
                  *this,dense_hashtable<std::pair<const_int,_int>,_int,_Hasher,_google::dense_hash_map<int,_int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::SelectKey,_google::dense_hash_map<int,_int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::SetKey,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
                        *ht,size_type min_buckets_wanted)

{
  int iVar1;
  undefined4 uVar2;
  bool bVar3;
  sh_hashtable_settings<int,_Hasher,_unsigned_long,_4> *this_00;
  dense_hashtable<std::pair<const_int,_int>,_int,_Hasher,_google::dense_hash_map<int,_int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::SelectKey,_google::dense_hash_map<int,_int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::SetKey,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
  *in_RSI;
  dense_hashtable<std::pair<const_int,_int>,_int,_Hasher,_google::dense_hash_map<int,_int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::SelectKey,_google::dense_hash_map<int,_int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::SetKey,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
  *in_RDI;
  sh_hashtable_settings<int,_Hasher,_unsigned_long,_4> *unaff_retaddr;
  size_type in_stack_00000020;
  dense_hashtable<std::pair<const_int,_int>,_int,_Hasher,_google::dense_hash_map<int,_int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::SelectKey,_google::dense_hash_map<int,_int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::SetKey,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
  *in_stack_00000028;
  size_type in_stack_ffffffffffffffb8;
  sh_hashtable_settings<int,_Hasher,_unsigned_long,_4> *in_stack_ffffffffffffffc0;
  dense_hashtable<std::pair<const_int,_int>,_int,_Hasher,_google::dense_hash_map<int,_int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::SelectKey,_google::dense_hash_map<int,_int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::SetKey,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
  *num_elts;
  
  num_elts = in_RDI;
  memcpy(in_RDI,in_RSI,0x30);
  iVar1 = (in_RSI->key_info).super_Hasher.num_hashes_;
  (in_RDI->key_info).super_Hasher.id_ = (in_RSI->key_info).super_Hasher.id_;
  (in_RDI->key_info).super_Hasher.num_hashes_ = iVar1;
  *(undefined8 *)&(in_RDI->key_info).super_Hasher.num_compares_ =
       *(undefined8 *)&(in_RSI->key_info).super_Hasher.num_compares_;
  (in_RDI->key_info).empty_key = (in_RSI->key_info).empty_key;
  in_RDI->num_deleted = 0;
  in_RDI->num_elements = 0;
  in_RDI->num_buckets = 0;
  uVar2 = *(undefined4 *)
           &(in_RSI->val_info).
            super_alloc_impl<Alloc<std::pair<const_int,_int>,_unsigned_long,_18446744073709551615UL>_>
            .super_Alloc<std::pair<const_int,_int>,_unsigned_long,_18446744073709551615UL>.field_0x4
  ;
  (in_RDI->val_info).
  super_alloc_impl<Alloc<std::pair<const_int,_int>,_unsigned_long,_18446744073709551615UL>_>.
  super_Alloc<std::pair<const_int,_int>,_unsigned_long,_18446744073709551615UL>.id_ =
       (in_RSI->val_info).
       super_alloc_impl<Alloc<std::pair<const_int,_int>,_unsigned_long,_18446744073709551615UL>_>.
       super_Alloc<std::pair<const_int,_int>,_unsigned_long,_18446744073709551615UL>.id_;
  *(undefined4 *)
   &(in_RDI->val_info).
    super_alloc_impl<Alloc<std::pair<const_int,_int>,_unsigned_long,_18446744073709551615UL>_>.
    super_Alloc<std::pair<const_int,_int>,_unsigned_long,_18446744073709551615UL>.field_0x4 = uVar2;
  (in_RDI->val_info).
  super_alloc_impl<Alloc<std::pair<const_int,_int>,_unsigned_long,_18446744073709551615UL>_>.
  super_Alloc<std::pair<const_int,_int>,_unsigned_long,_18446744073709551615UL>.count_ =
       (in_RSI->val_info).
       super_alloc_impl<Alloc<std::pair<const_int,_int>,_unsigned_long,_18446744073709551615UL>_>.
       super_Alloc<std::pair<const_int,_int>,_unsigned_long,_18446744073709551615UL>.count_;
  in_RDI->table = (pointer)0x0;
  bVar3 = sparsehash_internal::sh_hashtable_settings<int,_Hasher,_unsigned_long,_4>::use_empty
                    ((sh_hashtable_settings<int,_Hasher,_unsigned_long,_4> *)in_RSI);
  if (bVar3) {
    bucket_count(in_RDI);
    sparsehash_internal::sh_hashtable_settings<int,_Hasher,_unsigned_long,_4>::reset_thresholds
              (in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8);
    dense_hashtable<std::pair<int_const,int>,int,Hasher,google::dense_hash_map<int,int,Hasher,Hasher,Alloc<int,unsigned_long,18446744073709551615ul>>::SelectKey,google::dense_hash_map<int,int,Hasher,Hasher,Alloc<int,unsigned_long,18446744073709551615ul>>::SetKey,Hasher,Alloc<int,unsigned_long,18446744073709551615ul>>
    ::
    copy_or_move_from<google::dense_hashtable<std::pair<int_const,int>,int,Hasher,google::dense_hash_map<int,int,Hasher,Hasher,Alloc<int,unsigned_long,18446744073709551615ul>>::SelectKey,google::dense_hash_map<int,int,Hasher,Hasher,Alloc<int,unsigned_long,18446744073709551615ul>>::SetKey,Hasher,Alloc<int,unsigned_long,18446744073709551615ul>>const&>
              ((dense_hashtable<std::pair<const_int,_int>,_int,_Hasher,_google::dense_hash_map<int,_int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::SelectKey,_google::dense_hash_map<int,_int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::SetKey,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
                *)min_buckets_wanted,in_stack_00000028,in_stack_00000020);
  }
  else {
    size(in_RSI);
    this_00 = (sh_hashtable_settings<int,_Hasher,_unsigned_long,_4> *)
              sparsehash_internal::sh_hashtable_settings<int,_Hasher,_unsigned_long,_4>::min_buckets
                        (unaff_retaddr,(size_type)num_elts,(size_type)in_RSI);
    in_RDI->num_buckets = (size_type)this_00;
    bucket_count(in_RDI);
    sparsehash_internal::sh_hashtable_settings<int,_Hasher,_unsigned_long,_4>::reset_thresholds
              (this_00,in_stack_ffffffffffffffb8);
  }
  return;
}

Assistant:

dense_hashtable(const dense_hashtable& ht,
                  size_type min_buckets_wanted = HT_DEFAULT_STARTING_BUCKETS)
      : settings(ht.settings),
        key_info(ht.key_info),
        num_deleted(0),
        num_elements(0),
        num_buckets(0),
        val_info(ht.val_info),
        table(NULL) {
    if (!ht.settings.use_empty()) {
      // If use_empty isn't set, copy_from will crash, so we do our own copying.
      assert(ht.empty());
      num_buckets = settings.min_buckets(ht.size(), min_buckets_wanted);
      settings.reset_thresholds(bucket_count());
      return;
    }
    settings.reset_thresholds(bucket_count());
    copy_or_move_from(ht, min_buckets_wanted);  // copy_or_move_from() ignores deleted entries
  }